

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O0

StorageIndex * duckdb::GetStorageIndex(TableCatalogEntry *table,ColumnIndex *column_id)

{
  bool bVar1;
  ColumnDefinition *this;
  storage_t *psVar2;
  ColumnIndex *in_RDX;
  LogicalIndex in_RSI;
  StorageIndex *in_RDI;
  ColumnIndex *in_stack_00000038;
  ColumnDefinition *col;
  StorageIndex *result;
  TableCatalogEntry *in_stack_ffffffffffffff98;
  
  bVar1 = ColumnIndex::IsRowIdColumn(in_RDX);
  if (bVar1) {
    StorageIndex::StorageIndex((StorageIndex *)0x148f9ba);
  }
  else {
    ColumnIndex::ToLogical((ColumnIndex *)in_stack_ffffffffffffff98);
    this = TableCatalogEntry::GetColumn(in_stack_ffffffffffffff98,in_RSI);
    TransformStorageIndex(in_stack_00000038);
    psVar2 = ColumnDefinition::StorageOid(this);
    StorageIndex::SetIndex(in_RDI,*psVar2);
  }
  return in_RDI;
}

Assistant:

static StorageIndex GetStorageIndex(TableCatalogEntry &table, const ColumnIndex &column_id) {
	if (column_id.IsRowIdColumn()) {
		return StorageIndex();
	}

	// The index of the base ColumnIndex is equal to the physical column index in the table
	// for any child indices because the indices are already the physical indices.
	// Only the top-level can have generated columns.
	auto &col = table.GetColumn(column_id.ToLogical());
	auto result = TransformStorageIndex(column_id);
	result.SetIndex(col.StorageOid());
	return result;
}